

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv_loop_delete(uv_loop_t *loop)

{
  uv_loop_t *puVar1;
  int iVar2;
  int *piVar3;
  
  puVar1 = default_loop_ptr;
  iVar2 = uv_loop_close(loop);
  if (iVar2 == 0) {
    if (puVar1 != loop) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      (*(code *)uv__allocator_3)(loop);
      *piVar3 = iVar2;
    }
    return;
  }
  __assert_fail("err == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/uv-common.c"
                ,0x34f,"void uv_loop_delete(uv_loop_t *)");
}

Assistant:

void uv_loop_delete(uv_loop_t* loop) {
  uv_loop_t* default_loop;
  int err;

  default_loop = default_loop_ptr;

  err = uv_loop_close(loop);
  (void) err;    /* Squelch compiler warnings. */
  assert(err == 0);
  if (loop != default_loop)
    uv__free(loop);
}